

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::noOverlapMerge
          (AlignmentRecord *this,BamAlignment *alignment,string *dna,string *qualities,
          string *nucigar,vector<char,_std::allocator<char>_> *cigar_temp_unrolled,int *c_pos,
          int *q_pos,int *ref_pos)

{
  char cVar1;
  reference pvVar2;
  char *pcVar3;
  string *in_RCX;
  string *in_RDX;
  long in_RSI;
  string *in_R8;
  vector<char,_std::allocator<char>_> *in_R9;
  char c;
  
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     (in_R9,(long)*(int *)&(cigar_temp_unrolled->
                                           super__Vector_base<char,_std::allocator<char>_>)._M_impl)
  ;
  cVar1 = *pvVar2;
  if (cVar1 == 'H') {
    *(int *)qualities = *(int *)qualities + 1;
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
  }
  else if (cVar1 == 'I') {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x28);
    std::__cxx11::string::operator+=(in_RDX,*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x68);
    std::__cxx11::string::operator+=(in_RCX,*pcVar3);
    std::__cxx11::string::operator+=(in_R8,'I');
    *(int *)nucigar = *(int *)nucigar + 1;
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
  }
  else if (cVar1 == 'D') {
    std::__cxx11::string::operator+=(in_R8,'D');
    *(int *)qualities = *(int *)qualities + 1;
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
  }
  else if (cVar1 == 'S') {
    *(int *)qualities = *(int *)qualities + 1;
    *(int *)nucigar = *(int *)nucigar + 1;
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
  }
  else if (cVar1 == 'M') {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x28);
    std::__cxx11::string::operator+=(in_RDX,*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x68);
    std::__cxx11::string::operator+=(in_RCX,*pcVar3);
    std::__cxx11::string::operator+=(in_R8,'M');
    *(int *)qualities = *(int *)qualities + 1;
    *(int *)nucigar = *(int *)nucigar + 1;
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
  }
  return;
}

Assistant:

void AlignmentRecord::noOverlapMerge(const BamTools::BamAlignment& alignment, std::string& dna, std::string& qualities, std::string& nucigar, std::vector<char>& cigar_temp_unrolled, int& c_pos, int& q_pos, int& ref_pos) const{
    char c = cigar_temp_unrolled[c_pos];
    if (c == 'H'){
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += alignment.QueryBases[q_pos];
        qualities += alignment.Qualities[q_pos];
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += alignment.QueryBases[q_pos];
        qualities += alignment.Qualities[q_pos];
        nucigar += c;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);
    }
}